

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O0

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinSCAN_C,void>::
eval_exc_vxc_inc_<double&,int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&,double*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinSCAN_C,_void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6,
          double **args_7,double **args_8,double **args_9,double **args_10)

{
  bool bVar1;
  host_buffer_type in_RDX;
  const_host_buffer_type unaff_RBX;
  const_host_buffer_type in_RSI;
  BuiltinKernel *in_RDI;
  const_host_buffer_type unaff_retaddr;
  int in_stack_0000000c;
  double in_stack_00000010;
  const_host_buffer_type in_stack_00000090;
  const_host_buffer_type in_stack_00000098;
  int in_stack_000000a4;
  double in_stack_000000a8;
  host_buffer_type in_stack_000000c0;
  host_buffer_type in_stack_000000c8;
  host_buffer_type in_stack_000000d0;
  host_buffer_type in_stack_000000d8;
  
  bVar1 = BuiltinKernel::is_polarized(in_RDI);
  if (bVar1) {
    host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinSCAN_C>
              (in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000090,
               (const_host_buffer_type)args_10,(const_host_buffer_type)args_9,
               (host_buffer_type)args_8,in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,
               in_stack_000000d8);
  }
  else {
    host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinSCAN_C>
              (in_stack_00000010,in_stack_0000000c,unaff_retaddr,unaff_RBX,
               (const_host_buffer_type)in_RDI,in_RSI,in_RDX,(host_buffer_type)args_4,
               (host_buffer_type)args_3,(host_buffer_type)args_2,(host_buffer_type)args_1);
  }
  return;
}

Assistant:

void eval_exc_vxc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }